

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O1

void __thiscall
Atari2600::TIA::Player::enqueue_pixels(Player *this,int start,int end,int from_horizontal_counter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = this->queue_write_pointer_;
  this->queue_[iVar1].start = start;
  this->queue_[iVar1].end = end;
  iVar3 = this->pixel_position;
  this->queue_[iVar1].pixel_position = iVar3;
  iVar2 = this->adder;
  this->queue_[iVar1].adder = iVar2;
  this->queue_[iVar1].reverse_mask = this->reverse_mask;
  this->queue_write_pointer_ = iVar1 + 1U & 3;
  iVar1 = this->pixel_counter;
  iVar3 = iVar2 * (end - start) + iVar3;
  iVar2 = 0x20;
  if (iVar3 < 0x20) {
    iVar2 = iVar3;
  }
  this->pixel_position = iVar2;
  iVar3 = (end - start) + iVar1;
  this->pixel_counter = iVar3;
  if (3 < iVar3 && (iVar1 < 4 && this->copy_index_ == 0)) {
    this->latched_pixel4_time = (from_horizontal_counter - iVar1) + 4;
  }
  return;
}

Assistant:

void enqueue_pixels(const int start, const int end, int from_horizontal_counter) {
				queue_[queue_write_pointer_].start = start;
				queue_[queue_write_pointer_].end = end;
				queue_[queue_write_pointer_].pixel_position = pixel_position;
				queue_[queue_write_pointer_].adder = adder;
				queue_[queue_write_pointer_].reverse_mask = reverse_mask;
				queue_write_pointer_ = (queue_write_pointer_ + 1)&3;
				skip_pixels(end - start, from_horizontal_counter);
			}